

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

bool __thiscall MapLoader::fileIsValid(MapLoader *this)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  istream *piVar5;
  void *this_00;
  bool local_5a2;
  bool local_53c;
  byte local_53a;
  int local_488;
  allocator local_481;
  int adjacentCount;
  string line;
  int lineNumber;
  int numbOfNodes;
  ifstream input;
  undefined1 local_250 [8];
  ofstream output;
  allocator local_39;
  string local_38 [8];
  string mapExt;
  MapLoader *this_local;
  
  mapExt.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,".map",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  lVar3 = std::__cxx11::string::find((string *)&this->filePath,(ulong)local_38);
  if (lVar3 == -1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "The file requested does not contain a .map extension.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::ofstream::ofstream(local_250);
  std::ifstream::ifstream(&lineNumber);
  std::ifstream::open(&lineNumber,&this->filePath,8);
  bVar1 = std::ios::operator!((ios *)((long)&lineNumber + *(long *)(_lineNumber + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::ifstream::close();
    poVar4 = std::operator<<((ostream *)&std::cerr,"The file at ");
    poVar4 = std::operator<<(poVar4,(string *)&this->filePath);
    poVar4 = std::operator<<(poVar4," could not be opened.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  line.field_2._12_4_ = 0;
  line.field_2._8_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&adjacentCount,"",&local_481);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  while( true ) {
    do {
      piVar5 = std::operator>>((istream *)&lineNumber,(string *)&adjacentCount);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Number of nodes ");
        this_00 = (void *)std::ostream::operator<<(poVar4,line.field_2._12_4_);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        bVar2 = (int)line.field_2._12_4_ < 1;
        if (bVar2) {
          std::ifstream::close();
        }
        else {
          std::ifstream::close();
          this->nodeCount = line.field_2._12_4_;
        }
        this_local._7_1_ = !bVar2;
        std::__cxx11::string::~string((string *)&adjacentCount);
        std::ifstream::~ifstream(&lineNumber);
        std::ofstream::~ofstream(local_250);
        std::__cxx11::string::~string(local_38);
        return this_local._7_1_;
      }
      line.field_2._8_4_ = line.field_2._8_4_ + 1;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &adjacentCount,"@node");
    } while (!bVar2);
    line.field_2._12_4_ = line.field_2._12_4_ + 1;
    std::operator>>((istream *)&lineNumber,(string *)&adjacentCount);
    line.field_2._8_4_ = line.field_2._8_4_ + 1;
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &adjacentCount,"{");
    if (bVar2) {
      std::ifstream::close();
      poVar4 = std::operator<<((ostream *)&std::cout,"Missing opening brace in file ");
      poVar4 = std::operator<<(poVar4,(string *)&this->filePath);
      poVar4 = std::operator<<(poVar4," near line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,line.field_2._8_4_);
      poVar4 = std::operator<<(poVar4,".");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    std::operator>>((istream *)&lineNumber,(string *)&adjacentCount);
    line.field_2._8_4_ = line.field_2._8_4_ + 1;
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &adjacentCount,"name:");
    if (bVar2) {
      std::ifstream::close();
      poVar4 = std::operator<<((ostream *)&std::cout,"Missing node name field in file ");
      poVar4 = std::operator<<(poVar4,(string *)&this->filePath);
      poVar4 = std::operator<<(poVar4," near line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,line.field_2._8_4_);
      poVar4 = std::operator<<(poVar4,".");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    while( true ) {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &adjacentCount,"type:");
      local_53a = 0;
      if (bVar2) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&adjacentCount,"adjacent:");
        local_53c = true;
        if (!bVar2) {
          local_53c = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&adjacentCount,"}");
        }
        local_53a = local_53c ^ 0xff;
      }
      if ((local_53a & 1) == 0) break;
      std::operator>>((istream *)&lineNumber,(string *)&adjacentCount);
      line.field_2._8_4_ = line.field_2._8_4_ + 1;
    }
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &adjacentCount,"type:");
    if (bVar2) break;
    std::operator>>((istream *)&lineNumber,(string *)&adjacentCount);
    line.field_2._8_4_ = line.field_2._8_4_ + 1;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &adjacentCount,"master");
    if (((!bVar2) &&
        (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&adjacentCount,"inner"), !bVar2)) &&
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&adjacentCount,"outer"), !bVar2)) {
      std::ifstream::close();
      poVar4 = std::operator<<((ostream *)&std::cout,"Invalid type field in file ");
      poVar4 = std::operator<<(poVar4,(string *)&this->filePath);
      poVar4 = std::operator<<(poVar4," near line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,line.field_2._8_4_);
      poVar4 = std::operator<<(poVar4,".");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    local_488 = 0;
    while( true ) {
      piVar5 = std::operator>>((istream *)&lineNumber,(string *)&adjacentCount);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      local_5a2 = false;
      if (bVar2) {
        local_5a2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&adjacentCount,"}");
      }
      if (local_5a2 == false) break;
      line.field_2._8_4_ = line.field_2._8_4_ + 1;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &adjacentCount,"adjacent:");
      if (bVar2) {
        local_488 = local_488 + 1;
      }
    }
    if (local_488 == 0) {
      std::ifstream::close();
      poVar4 = std::operator<<((ostream *)&std::cout,"No adjacent nodes found in ");
      poVar4 = std::operator<<(poVar4,(string *)&this->filePath);
      poVar4 = std::operator<<(poVar4," near line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,line.field_2._8_4_);
      poVar4 = std::operator<<(poVar4,".");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &adjacentCount,"}");
    if (bVar2) {
      std::ifstream::close();
      poVar4 = std::operator<<((ostream *)&std::cout,"Missing closing brace in file ");
      poVar4 = std::operator<<(poVar4,(string *)&this->filePath);
      poVar4 = std::operator<<(poVar4," near line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,line.field_2._8_4_);
      poVar4 = std::operator<<(poVar4,".");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
  }
  std::ifstream::close();
  poVar4 = std::operator<<((ostream *)&std::cout,"Missing type field in file ");
  poVar4 = std::operator<<(poVar4,(string *)&this->filePath);
  poVar4 = std::operator<<(poVar4," near line ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,line.field_2._8_4_);
  poVar4 = std::operator<<(poVar4,".");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

bool MapLoader::fileIsValid()
{
  //method to check if the file is valid

  //before doing anything, check if the file path contains a .map extension
  string mapExt = ".map";

  if(filePath.find(mapExt) == string::npos)
  {
    cerr << "The file requested does not contain a .map extension." << endl;
    exit(0);
    return false;
  }


  //first we will attempt to open the file
  ofstream output;
  ifstream input; //the input stream associated to out file
  input.open(filePath); //try opening the file


  if(!input)
  {
    //if the input file could not be opened, then that means that the input file is not valid
    //therefore close the stream and return false
    input.close();
    cerr << "The file at " << filePath << " could not be opened." << endl;
    exit(0);
    return false;
  }

  //if we passed this point, it means that the file is open

  //we need to check each node to make sure that it is correctly formed
  int numbOfNodes = 0; //the count of the number of nodes in the file
  int lineNumber = 0; //the line we are at

  //now we need to count the number of times the word "@node" is contained in the file
  string line = ""; //the current line being read
  while(input >> line) //while the input stream still has lines to read keep reading
  {
    lineNumber++;

    if(line == "@node") //if the line is equal to "@node", this is the inclusion of another node
    {
      numbOfNodes++;
      //now we know that we are at the beginning of a node declaration
      //check the next line to see if it is a "{"
      input >> line;
      lineNumber++;
      if(line != "{")
      {
        input.close();
        cout << "Missing opening brace in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

      //then check if the line after that contains a name field
      input >> line;
      lineNumber++;
      if(line != "name:")
      {
        input.close();
        cout << "Missing node name field in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false; //if the next line does not contain a name field then we return false
      }

      //then check if the line after that contains a type field
      while(line != "type:" && !(line == "adjacent:" || line == "}"))
      {
        input >> line;
        lineNumber++;
      }

      if(line != "type:")
      {
        input.close();
        cout << "Missing type field in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

      //then check that the type is valid
      input >> line;
      lineNumber++;
      if(!(line == "master" || line == "inner" || line == "outer"))
      {
        input.close();
        cout << "Invalid type field in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
      }

      //now we need to make sure that the node has at least one adjacent node to make sure that the graph will be a connected graph
      int adjacentCount = 0;
      while(input >> line && line != "}")
      {
        lineNumber++;
        if(line == "adjacent:")
        {
          adjacentCount ++;
        }
      }

      //if by the end of the loop the adjacent count is still zero, then the file is not valid
      if(adjacentCount == 0)
      {
        input.close();
        cout << "No adjacent nodes found in " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

      //now that we have reached the last adjacent node, check if the current line contains a "}"
      if(line != "}")
      {
        input.close();
        cout << "Missing closing brace in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

    }

  }

  //if we made it to this point without returning, then that means the file is valid and we return true
  //as long as there is more than one node

  cout << "Number of nodes " << numbOfNodes << endl;
  if(numbOfNodes > 0)
  {
    input.close();
    nodeCount = numbOfNodes;
    return true;
  }

  //if there was not more than one node, then return false;
  input.close();
  return false;

}